

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall
ON_Font::ReadV5(ON_Font *this,ON_BinaryArchive *file,int *V5_font_index,ON_UUID *V5_font_id)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  bool bVar6;
  RuntimeEnvironment RVar7;
  uchar uVar8;
  Weight prefered_weight;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  wchar_t *pwVar12;
  long lVar13;
  wchar_t *windows_logfont_name_00;
  ON_Font *src;
  ON_wString *src_00;
  Style prefered_style;
  undefined1 auVar14 [16];
  int logfont_weight;
  ON_wString postscript_name;
  ON_wString windows_logfont_name;
  ON__INT32 local_200;
  int minor_version;
  ON_wString corrupt_information_font_description;
  int bItalic;
  int major_version;
  ON_UUID uuid;
  double obsolete_linefeed_ratio;
  wchar_t facename [65];
  unsigned_short sh [64];
  
  operator=(this,&Unset);
  if (V5_font_index != (int *)0x0) {
    *V5_font_index = -1;
  }
  if (V5_font_id != (ON_UUID *)0x0) {
    V5_font_id->Data1 = 0;
    V5_font_id->Data2 = 0;
    V5_font_id->Data3 = 0;
    V5_font_id->Data4[0] = '\0';
    V5_font_id->Data4[1] = '\0';
    V5_font_id->Data4[2] = '\0';
    V5_font_id->Data4[3] = '\0';
    V5_font_id->Data4[4] = '\0';
    V5_font_id->Data4[5] = '\0';
    V5_font_id->Data4[6] = '\0';
    V5_font_id->Data4[7] = '\0';
  }
  major_version = 0;
  minor_version = 0;
  bVar6 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if (!bVar6) {
    operator=(this,&Default);
    return false;
  }
  ON_wString::ON_wString(&windows_logfont_name);
  ON_wString::ON_wString(&postscript_name);
  logfont_weight = 0;
  if ((major_version != 1) || (bVar6 = ON_BinaryArchive::ReadInt(file,&local_200), !bVar6)) {
    prefered_style = Upright;
    prefered_weight = Normal;
    bVar6 = false;
    goto LAB_00487e2d;
  }
  if (V5_font_index != (int *)0x0) {
    *V5_font_index = local_200;
  }
  ON_wString::ON_wString(&corrupt_information_font_description);
  bVar6 = ON_BinaryArchive::ReadString(file,&corrupt_information_font_description);
  if (bVar6) {
    pwVar12 = ON_wString::operator_cast_to_wchar_t_(&corrupt_information_font_description);
    if (((pwVar12 != (wchar_t *)0x0) && (*pwVar12 != L'\0')) &&
       (bVar6 = ON_wString::EqualOrdinal(L"Default",pwVar12,true), !bVar6)) {
      RVar7 = ON_BinaryArchive::ArchiveRuntimeEnvironment(file);
      if (RVar7 != Apple) {
        uVar10 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
        uVar11 = ON_VersionNumberConstruct(6,2,0x7e2,2,0x17,0);
        if (uVar10 <= uVar11) goto LAB_00487c85;
      }
      ON_wString::operator=(&postscript_name,&corrupt_information_font_description);
    }
LAB_00487c85:
    bVar6 = ON_BinaryArchive::ReadShort(file,0x40,sh);
    if (!bVar6) goto LAB_00487e1b;
    lVar13 = 0;
    do {
      uVar1 = *(ulong *)(sh + lVar13);
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar1;
      auVar2._12_2_ = (short)(uVar1 >> 0x30);
      auVar3._8_2_ = (short)(uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._10_4_ = auVar2._10_4_;
      auVar5._6_8_ = 0;
      auVar5._0_6_ = auVar3._8_6_;
      auVar4._4_2_ = (short)(uVar1 >> 0x10);
      auVar4._0_4_ = (uint)uVar1;
      auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
      auVar14._0_4_ = (uint)uVar1 & 0xffff;
      auVar14._4_10_ = auVar4._4_10_;
      auVar14._14_2_ = 0;
      *(undefined1 (*) [16])(facename + lVar13) = auVar14;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x40);
    local_200 = 0x40;
    facename[0x40] = L'\0';
    ON_wString::operator=(&windows_logfont_name,facename);
    bVar6 = ON_wString::IsNotEmpty(&this->m_loc_windows_logfont_name);
    src_00 = &this->m_en_windows_logfont_name;
    if (bVar6) {
      src_00 = &this->m_loc_windows_logfont_name;
    }
    ON_wString::ON_wString((ON_wString *)&uuid,src_00);
    pwVar12 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&uuid);
    uVar8 = WindowsLogfontCharSetFromFaceName(pwVar12);
    this->m_logfont_charset = uVar8;
    ON_wString::~ON_wString((ON_wString *)&uuid);
    prefered_style = Upright;
    prefered_weight = Normal;
    if (0 < minor_version) {
      bVar6 = ON_BinaryArchive::ReadInt(file,&logfont_weight);
      if (bVar6) {
        prefered_weight = Normal;
        if (logfont_weight - 100U < 0x385) {
          prefered_weight = WeightFromWindowsLogfontWeight(logfont_weight);
        }
        bItalic = 0;
        bVar6 = ON_BinaryArchive::ReadInt(file,&bItalic);
        if (bVar6) {
          prefered_style = Italic - (bItalic == 0);
          obsolete_linefeed_ratio = 1.6;
          bVar9 = ON_BinaryArchive::ReadDouble(file,&obsolete_linefeed_ratio);
          bVar6 = true;
          if (bVar9) {
            if (1 < minor_version) {
              uuid.Data1 = 0;
              uuid.Data2 = 0;
              uuid.Data3 = 0;
              uuid.Data4[0] = '\0';
              uuid.Data4[1] = '\0';
              uuid.Data4[2] = '\0';
              uuid.Data4[3] = '\0';
              uuid.Data4[4] = '\0';
              uuid.Data4[5] = '\0';
              uuid.Data4[6] = '\0';
              uuid.Data4[7] = '\0';
              bVar9 = ON_BinaryArchive::ReadUuid(file,&uuid);
              if (V5_font_id != (ON_UUID *)0x0 && bVar9) {
                V5_font_id->Data1 = uuid.Data1;
                V5_font_id->Data2 = uuid.Data2;
                V5_font_id->Data3 = uuid.Data3;
                *&V5_font_id->Data4 = uuid.Data4;
              }
              bVar6 = (V5_font_id == (ON_UUID *)0x0 || !bVar9) && !bVar9;
              if (!bVar9) goto LAB_00487fa7;
            }
            bVar6 = false;
          }
LAB_00487fa7:
          bVar6 = !bVar6;
          goto LAB_00487e23;
        }
      }
      goto LAB_00487e21;
    }
    bVar6 = true;
  }
  else {
LAB_00487e1b:
    prefered_weight = Normal;
LAB_00487e21:
    prefered_style = Upright;
    bVar6 = false;
  }
LAB_00487e23:
  ON_wString::~ON_wString(&corrupt_information_font_description);
LAB_00487e2d:
  ON_ManagedFonts::InstalledFonts();
  pwVar12 = ON_wString::operator_cast_to_wchar_t_(&postscript_name);
  windows_logfont_name_00 = ON_wString::operator_cast_to_wchar_t_(&windows_logfont_name);
  src = ON_FontList::Internal_FromNames
                  (&ON_ManagedFonts::List.m_installed_fonts,pwVar12,windows_logfont_name_00,
                   (wchar_t *)0x0,(wchar_t *)0x0,prefered_weight,Unset,prefered_style,false,true,
                   false,false,false,0.0);
  if ((src == (ON_Font *)0x0 & bVar6) == 0) {
    if (src == (ON_Font *)0x0) {
      src = &Default;
    }
    operator=(this,src);
  }
  else {
    pwVar12 = ON_wString::operator_cast_to_wchar_t_(&windows_logfont_name);
    SetWindowsLogfontName(this,pwVar12);
    Internal_SetFontWeightTrio(this,prefered_weight,logfont_weight,-1.23432101234321e+308,false);
    ON_wString::operator=(&this->m_loc_postscript_name,&postscript_name);
    ON_wString::operator=(&this->m_en_postscript_name,&this->m_loc_postscript_name);
    pwVar12 = ON_wString::operator_cast_to_wchar_t_(&this->m_loc_windows_logfont_name);
    FamilyNameFromDirtyName((ON_Font *)facename,pwVar12);
    ON_wString::operator=(&this->m_loc_family_name,(ON_wString *)facename);
    ON_wString::~ON_wString((ON_wString *)facename);
    pwVar12 = ON_wString::operator_cast_to_wchar_t_(&this->m_en_windows_logfont_name);
    FamilyNameFromDirtyName((ON_Font *)facename,pwVar12);
    ON_wString::operator=(&this->m_en_family_name,(ON_wString *)facename);
    ON_wString::~ON_wString((ON_wString *)facename);
  }
  ON_wString::~ON_wString(&postscript_name);
  ON_wString::~ON_wString(&windows_logfont_name);
  return bVar6;
}

Assistant:

bool ON_Font::ReadV5(
  ON_BinaryArchive& file, // restore definition from binary archive
  int* V5_font_index,
  ON_UUID* V5_font_id
  )
{
  *this = ON_Font::Unset;

  if ( nullptr != V5_font_index )
    *V5_font_index = -1;
  if ( nullptr != V5_font_id )
    *V5_font_id = ON_nil_uuid;
  
  int major_version = 0;
  int minor_version = 0;
  if (!file.Read3dmChunkVersion(&major_version, &minor_version))
  {
    *this = ON_Font::Default;
    return false;
  }

  bool rc = false;

  ON_wString windows_logfont_name;
  ON_wString postscript_name;
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  ON_Font::Stretch font_stretch = ON_Font::Stretch::Unset;
  ON_Font::Style font_style = ON_Font::Style::Upright;
  int logfont_weight = 0;

  for (;;)
  {
    if ( 1 != major_version )
      break;
    int i;
    if (!file.ReadInt(&i))
      break;
    if ( nullptr != V5_font_index )
      *V5_font_index = i;

    ON_wString corrupt_information_font_description;
    if (!file.ReadString(corrupt_information_font_description))
      break;

    if ( false == ON_Font::IsNotAppleFontName(corrupt_information_font_description)  )
    {
      if (ON::RuntimeEnvironment::Apple == file.ArchiveRuntimeEnvironment())
      {
        // Files written by Mac Rhino 5 for Mac have the Apple font name stored in this string.
        postscript_name = corrupt_information_font_description;
      }
      else if ( file.ArchiveOpenNURBSVersion() > ON_VersionNumberConstruct(6, 2, 2018, 2, 23, 0) )
      {
        postscript_name = corrupt_information_font_description;
      }
    }
 
    // 18 October 2002 Dale Lear:
    //   This code deals with an old bug.
    //   The Windows LOGFONT.lfFaceName was written as an array of 64 unsigned shorts.
    unsigned short sh[64];
    if (!file.ReadShort(64, sh))
      break;

    wchar_t facename[65];
    for(i = 0; i < 64; i++)
      facename[i] = sh[i];
    facename[64] = 0;
    windows_logfont_name = facename;

    m_logfont_charset = ON_Font::WindowsLogfontCharSetFromFaceName(WindowsLogfontName());
    if (minor_version >= 1)
    {
      if (!file.ReadInt(&logfont_weight))
        break;

      if (logfont_weight >= 100 && logfont_weight <= 1000)
      {
        font_weight = ON_Font::WeightFromWindowsLogfontWeight(logfont_weight);
      }

      int bItalic = 0;
      if (!file.ReadInt(&bItalic))
        break;
      if ( 0 != bItalic )
        font_style = ON_Font::Style::Italic;

      double obsolete_linefeed_ratio = ON_FontMetrics::DefaultLineFeedRatio;
      if (!file.ReadDouble(&obsolete_linefeed_ratio))
        break;

      if (minor_version >= 2)
      {
        ON_UUID uuid = ON_nil_uuid;
        if (!file.ReadUuid(uuid))
          break;
        if ( nullptr != V5_font_id )
          *V5_font_id = uuid;
      }
    }

    rc = true;
    break;
  }

  const ON_Font* installed_font = ON_Font::InstalledFontList().FromNames(
    postscript_name,
    windows_logfont_name,
    nullptr,
    nullptr,
    font_weight,
    font_stretch,
    font_style,
    false,
    true
  );

  if (nullptr != installed_font)
  {
    *this = *installed_font;
  }
  else if (rc)
  {
    SetWindowsLogfontName(windows_logfont_name);
    Internal_SetFontWeightTrio(
      font_weight,
      logfont_weight,
      ON_UNSET_VALUE,
      false
    );
    m_loc_postscript_name = postscript_name;
    m_en_postscript_name = m_loc_postscript_name;
    m_loc_family_name = ON_Font::FamilyNameFromDirtyName(m_loc_windows_logfont_name);
    m_en_family_name = ON_Font::FamilyNameFromDirtyName(m_en_windows_logfont_name);
  }
  else
  {
    *this = ON_Font::Default;
  }

  return rc;
}